

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpulseGenerator.cpp
# Opt level: O3

int ImpulseGenerator::ReleaseCallback(UnityAudioEffectState *state)

{
  void *pvVar1;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = ImpulseGenerator::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    operator_delete(pvVar1,0x30);
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = ImpulseGenerator::EffectData]"
               );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ReleaseCallback(UnityAudioEffectState* state)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        delete data;
        return UNITY_AUDIODSP_OK;
    }